

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void do_shifts(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_i32 s,
              TCGOpcode opc_s,TCGOpcode opc_v)

{
  byte bVar1;
  int iVar2;
  TCGv_vec r_00;
  TCGTemp *ts;
  uintptr_t o_1;
  uintptr_t o;
  TCGType_conflict type;
  uintptr_t o_3;
  uintptr_t o_2;
  
  bVar1 = ((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r];
  type = (TCGType_conflict)bVar1;
  iVar2 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc_s,type,vece);
  if (iVar2 < 1) {
    if (-1 < iVar2) {
      r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
      if (vece == 3) {
        ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),s);
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,3,r_00,(TCGv_i64)((long)ts - (long)tcg_ctx));
        tcg_temp_free_internal_tricore(tcg_ctx,ts);
      }
      else {
        tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r_00,s);
      }
      do_op3(tcg_ctx,vece,r,a,r_00,opc_v);
      tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
      return;
    }
    tcg_expand_vec_op_tricore
              (tcg_ctx,opc_s,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
               a + (long)&tcg_ctx->pool_cur,s + (long)&tcg_ctx->pool_cur);
  }
  else {
    vec_gen_3_tricore(tcg_ctx,opc_s,type,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(a + (long)&tcg_ctx->pool_cur),(TCGArg)(s + (long)&tcg_ctx->pool_cur))
    ;
  }
  return;
}

Assistant:

static void do_shifts(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a,
                      TCGv_i32 s, TCGOpcode opc_s, TCGOpcode opc_v)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *st = tcgv_i32_temp(tcg_ctx, s);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg si = temp_arg(st);
    TCGType type = rt->base_type;
    const TCGOpcode *hold_list;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_assert_listed_vecop(opc_s);
    hold_list = tcg_swap_vecop_list(NULL);

    can = tcg_can_emit_vec_op(tcg_ctx, opc_s, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else if (can < 0) {
        tcg_expand_vec_op(tcg_ctx, opc_s, type, vece, ri, ai, si);
    } else {
        TCGv_vec vec_s = tcg_temp_new_vec(tcg_ctx, type);

        if (vece == MO_64) {
            TCGv_i64 s64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_extu_i32_i64(tcg_ctx, s64, s);
            tcg_gen_dup_i64_vec(tcg_ctx, MO_64, vec_s, s64);
            tcg_temp_free_i64(tcg_ctx, s64);
        } else {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, vec_s, s);
        }
        do_op3_nofail(tcg_ctx, vece, r, a, vec_s, opc_v);
        tcg_temp_free_vec(tcg_ctx, vec_s);
    }
    tcg_swap_vecop_list(hold_list);
}